

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  uint uVar1;
  int *piVar2;
  ImGuiContextHook *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ImGuiID IVar8;
  ImGuiContextHook *__dest;
  int iVar9;
  int iVar10;
  
  if (((*(long *)(hook + 0x10) == 0) || (*(int *)hook != 0)) || (*(int *)(hook + 4) == 7)) {
    __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xd5c,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
  }
  iVar7 = (ctx->Hooks).Size;
  if (iVar7 == (ctx->Hooks).Capacity) {
    if (iVar7 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar7 / 2 + iVar7;
    }
    iVar10 = iVar7 + 1;
    if (iVar7 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + 1;
    }
    __dest = (ImGuiContextHook *)(*GImAllocatorAllocFunc)((long)iVar10 << 5,GImAllocatorUserData);
    pIVar3 = (ctx->Hooks).Data;
    if (pIVar3 != (ImGuiContextHook *)0x0) {
      memcpy(__dest,pIVar3,(long)(ctx->Hooks).Size << 5);
      pIVar3 = (ctx->Hooks).Data;
      if ((pIVar3 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (ctx->Hooks).Data = __dest;
    (ctx->Hooks).Capacity = iVar10;
    iVar7 = (ctx->Hooks).Size;
  }
  else {
    __dest = (ctx->Hooks).Data;
  }
  uVar4 = *(undefined8 *)hook;
  uVar5 = *(undefined8 *)(hook + 8);
  uVar6 = *(undefined8 *)(hook + 0x18);
  *(undefined8 *)(__dest + (long)iVar7 * 0x20 + 0x10) = *(undefined8 *)(hook + 0x10);
  *(undefined8 *)(__dest + (long)iVar7 * 0x20 + 0x10 + 8) = uVar6;
  *(undefined8 *)(__dest + (long)iVar7 * 0x20) = uVar4;
  *(undefined8 *)(__dest + (long)iVar7 * 0x20 + 8) = uVar5;
  iVar7 = (ctx->Hooks).Size;
  IVar8 = ctx->HookIdNext;
  uVar1 = iVar7 + 1;
  (ctx->Hooks).Size = uVar1;
  IVar8 = IVar8 + 1;
  ctx->HookIdNext = IVar8;
  if (-1 < iVar7) {
    *(ImGuiID *)((ctx->Hooks).Data + (ulong)uVar1 * 0x20 + -0x20) = IVar8;
    return IVar8;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x695,"T &ImVector<ImGuiContextHook>::back() [T = ImGuiContextHook]");
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}